

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O3

send_result_t
zmq::send_multipart<std::array<zmq::const_buffer,2ul>&,void>
          (socket_ref s,array<zmq::const_buffer,_2UL> *msgs,send_flags flags)

{
  ulong extraout_RDX;
  undefined8 uVar1;
  _Storage<unsigned_long,_true> _Var2;
  int in_R8D;
  long lVar3;
  send_result_t sVar4;
  socket_base local_30;
  
  lVar3 = 0;
  _Var2._M_value = 0;
  local_30 = s.super_socket_base._handle;
  do {
    detail::socket_base::send
              (&local_30,(int)*(undefined8 *)((long)&msgs->_M_elems[0]._data + lVar3),
               *(void **)((long)&msgs->_M_elems[0]._size + lVar3),
               (ulong)((uint)(lVar3 != 0x10) * 2 | flags),in_R8D);
    if ((extraout_RDX & 1) == 0) {
      if (lVar3 != 0) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::array<zmq::const_buffer, 2> &]"
                     );
      }
      uVar1 = 0;
      goto LAB_0014818d;
    }
    lVar3 = lVar3 + 0x10;
    _Var2._M_value = _Var2._M_value + 1;
  } while (lVar3 != 0x20);
  uVar1 = CONCAT71((int7)(extraout_RDX >> 8),1);
  _Var2._M_value = 2;
LAB_0014818d:
  sVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar1;
  sVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var2._M_value;
  return (send_result_t)
         sVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}